

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::ErrorHandlerImpl::taskFailed(ErrorHandlerImpl *this,Exception *exception)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  DebugExpression<bool> _kjCondition;
  DebugExpression<bool> local_9;
  
  uVar2 = (exception->description).content.size_;
  if (uVar2 < 0x18) {
    local_9.value = false;
  }
  else {
    pcVar3 = (exception->description).content.ptr;
    pcVar1 = pcVar3 + (uVar2 - 0x18);
    pcVar3 = pcVar3 + (uVar2 - 0x11);
    auVar5[0] = -(*pcVar3 == (char)DAT_0048a020);
    auVar5[1] = -(pcVar3[1] == DAT_0048a020._1_1_);
    auVar5[2] = -(pcVar3[2] == DAT_0048a020._2_1_);
    auVar5[3] = -(pcVar3[3] == DAT_0048a020._3_1_);
    auVar5[4] = -(pcVar3[4] == DAT_0048a020._4_1_);
    auVar5[5] = -(pcVar3[5] == DAT_0048a020._5_1_);
    auVar5[6] = -(pcVar3[6] == DAT_0048a020._6_1_);
    auVar5[7] = -(pcVar3[7] == DAT_0048a020._7_1_);
    auVar5[8] = -(pcVar3[8] == ' ');
    auVar5[9] = -(pcVar3[9] == 'f');
    auVar5[10] = -(pcVar3[10] == 'a');
    auVar5[0xb] = -(pcVar3[0xb] == 'i');
    auVar5[0xc] = -(pcVar3[0xc] == 'l');
    auVar5[0xd] = -(pcVar3[0xd] == 'u');
    auVar5[0xe] = -(pcVar3[0xe] == 'r');
    auVar5[0xf] = -(pcVar3[0xf] == 'e');
    auVar4[0] = -(*pcVar1 == 'e');
    auVar4[1] = -(pcVar1[1] == 'x');
    auVar4[2] = -(pcVar1[2] == 'a');
    auVar4[3] = -(pcVar1[3] == 'm');
    auVar4[4] = -(pcVar1[4] == 'p');
    auVar4[5] = -(pcVar1[5] == 'l');
    auVar4[6] = -(pcVar1[6] == 'e');
    auVar4[7] = -(pcVar1[7] == ' ');
    auVar4[8] = -(pcVar1[8] == 'T');
    auVar4[9] = -(pcVar1[9] == 'a');
    auVar4[10] = -(pcVar1[10] == 's');
    auVar4[0xb] = -(pcVar1[0xb] == 'k');
    auVar4[0xc] = -(pcVar1[0xc] == 'S');
    auVar4[0xd] = -(pcVar1[0xd] == 'e');
    auVar4[0xe] = -(pcVar1[0xe] == 't');
    auVar4[0xf] = -(pcVar1[0xf] == ' ');
    auVar4 = auVar4 & auVar5;
    local_9.value =
         (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
    if (local_9.value) goto LAB_00195166;
  }
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3b8,ERROR,
               "\"failed: expected \" \"exception.getDescription().endsWith(\\\"example TaskSet failure\\\")\", _kjCondition"
               ,(char (*) [80])
                "failed: expected exception.getDescription().endsWith(\"example TaskSet failure\")",
               &local_9);
  }
LAB_00195166:
  this->exceptionCount = this->exceptionCount + 1;
  return;
}

Assistant:

void taskFailed(kj::Exception&& exception) override {
    EXPECT_TRUE(exception.getDescription().endsWith("example TaskSet failure"));
    ++exceptionCount;
  }